

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseLocalNameSuffix(State *state)

{
  bool bVar1;
  char *pcVar2;
  bool local_69;
  int local_48 [2];
  int number;
  undefined8 uStack_38;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    uStack_38._0_4_ = ((guard.state_)->parse_state).mangled_idx;
    uStack_38._4_4_ = ((guard.state_)->parse_state).out_cur_idx;
    copy.mangled_idx = ((guard.state_)->parse_state).prev_name_idx;
    copy.out_cur_idx = *(int *)&((guard.state_)->parse_state).field_0xc;
    bVar1 = ParseOneCharToken(guard.state_,'d');
    if (bVar1) {
      pcVar2 = RemainingInput(guard.state_);
      bVar1 = IsDigit(*pcVar2);
      if ((bVar1) || (pcVar2 = RemainingInput(guard.state_), *pcVar2 == '_')) {
        local_48[0] = -1;
        bVar1 = ParseNumber(guard.state_,local_48);
        Optional(bVar1);
        if ((local_48[0] < -1) || (0x7ffffffd < local_48[0])) {
          local_48[0] = -1;
        }
        local_48[0] = local_48[0] + 2;
        MaybeAppend(guard.state_,"::{default arg#");
        MaybeAppendDecimal(guard.state_,local_48[0]);
        MaybeAppend(guard.state_,"}::");
        bVar1 = ParseOneCharToken(guard.state_,'_');
        if ((bVar1) && (bVar1 = ParseName(guard.state_), bVar1)) {
          state_local._7_1_ = true;
        }
        else {
          ((guard.state_)->parse_state).mangled_idx = (undefined4)uStack_38;
          ((guard.state_)->parse_state).out_cur_idx = uStack_38._4_4_;
          ((guard.state_)->parse_state).prev_name_idx = copy.mangled_idx;
          *(int *)&((guard.state_)->parse_state).field_0xc = copy.out_cur_idx;
          if (*(int *)&((guard.state_)->parse_state).field_0xc < 0) {
            (guard.state_)->out[((guard.state_)->parse_state).out_cur_idx] = '\0';
          }
          state_local._7_1_ = false;
        }
        goto LAB_006c325b;
      }
    }
    ((guard.state_)->parse_state).mangled_idx = (undefined4)uStack_38;
    ((guard.state_)->parse_state).out_cur_idx = uStack_38._4_4_;
    ((guard.state_)->parse_state).prev_name_idx = copy.mangled_idx;
    *(int *)&((guard.state_)->parse_state).field_0xc = copy.out_cur_idx;
    bVar1 = MaybeAppend(guard.state_,"::");
    if ((bVar1) && (bVar1 = ParseName(guard.state_), bVar1)) {
      bVar1 = ParseDiscriminator(guard.state_);
      bVar1 = Optional(bVar1);
      if (bVar1) {
        state_local._7_1_ = true;
        goto LAB_006c325b;
      }
    }
    ((guard.state_)->parse_state).mangled_idx = (undefined4)uStack_38;
    ((guard.state_)->parse_state).out_cur_idx = uStack_38._4_4_;
    ((guard.state_)->parse_state).prev_name_idx = copy.mangled_idx;
    *(int *)&((guard.state_)->parse_state).field_0xc = copy.out_cur_idx;
    if (*(int *)&((guard.state_)->parse_state).field_0xc < 0) {
      (guard.state_)->out[((guard.state_)->parse_state).out_cur_idx] = '\0';
    }
    bVar1 = ParseOneCharToken(guard.state_,'s');
    local_69 = false;
    if (bVar1) {
      bVar1 = ParseDiscriminator(guard.state_);
      local_69 = Optional(bVar1);
    }
    state_local._7_1_ = local_69;
  }
LAB_006c325b:
  copy._12_4_ = 1;
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseLocalNameSuffix(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // <local-name-suffix> ::= d [<(parameter) number>] _ <name>
  if (ParseOneCharToken(state, 'd') &&
      (IsDigit(RemainingInput(state)[0]) || RemainingInput(state)[0] == '_')) {
    int number = -1;
    Optional(ParseNumber(state, &number));
    if (number < -1 || number > 2147483645) {
      // Work around overflow cases.  We do not expect these outside of a fuzzer
      // or other source of adversarial input.  If we do detect overflow here,
      // we'll print {default arg#1}.
      number = -1;
    }
    number += 2;

    // The ::{default arg#1}:: infix must be rendered before the lambda itself,
    // so print this before parsing the rest of the <local-name-suffix>.
    MaybeAppend(state, "::{default arg#");
    MaybeAppendDecimal(state, number);
    MaybeAppend(state, "}::");
    if (ParseOneCharToken(state, '_') && ParseName(state)) return true;

    // On late parse failure, roll back not only the input but also the output,
    // whose trailing NUL was overwritten.
    state->parse_state = copy;
    if (state->parse_state.append) {
      state->out[state->parse_state.out_cur_idx] = '\0';
    }
    return false;
  }
  state->parse_state = copy;

  // <local-name-suffix> ::= <name> [<discriminator>]
  if (MaybeAppend(state, "::") && ParseName(state) &&
      Optional(ParseDiscriminator(state))) {
    return true;
  }
  state->parse_state = copy;
  if (state->parse_state.append) {
    state->out[state->parse_state.out_cur_idx] = '\0';
  }

  // <local-name-suffix> ::= s [<discriminator>]
  return ParseOneCharToken(state, 's') && Optional(ParseDiscriminator(state));
}